

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covMinUtil.c
# Opt level: O0

int Min_CubeCheck(Min_Cube_t *pCube)

{
  int iVar1;
  int local_1c;
  int i;
  Min_Cube_t *pCube_local;
  
  local_1c = 0;
  while( true ) {
    if ((int)(*(uint *)&pCube->field_0x8 & 0x3ff) <= local_1c) {
      return 1;
    }
    iVar1 = Min_CubeGetVar(pCube,local_1c);
    if (iVar1 == 0) break;
    local_1c = local_1c + 1;
  }
  return 0;
}

Assistant:

int Min_CubeCheck( Min_Cube_t * pCube )
{
    int i;
    for ( i = 0; i < (int)pCube->nVars; i++ )
        if ( Min_CubeGetVar( pCube, i ) == 0 )
            return 0;
    return 1;
}